

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance_intersector.cpp
# Opt level: O2

bool embree::sse42::InstanceIntersector1MB::occluded
               (Precalculations *pre,Ray *ray,RayQueryContext *context,InstancePrimitive *prim)

{
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar1;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar2;
  Instance *pIVar3;
  RTCRayQueryContext *pRVar4;
  long lVar5;
  bool bVar6;
  uint uVar7;
  uint uVar8;
  AffineSpace3ff *pAVar9;
  AffineSpace3ff *pAVar10;
  float fVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar16 [12];
  float fVar15;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar19;
  float fVar22;
  float fVar23;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  float fVar26;
  vfloat4 l02;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar30 [16];
  float fVar31;
  float fVar33;
  float fVar34;
  undefined1 auVar32 [16];
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  vfloat4 a0;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  RayQueryContext newcontext;
  undefined1 local_f8 [8];
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined1 auVar29 [16];
  
  pIVar3 = prim->instance;
  if (((ray->mask & (pIVar3->super_Geometry).mask) == 0) ||
     (pRVar4 = context->user, pRVar4->instID[0] != 0xffffffff)) {
    bVar6 = false;
  }
  else {
    pRVar4->instID[0] = prim->instID_;
    pRVar4->instPrimID[0] = 0;
    if ((pIVar3->super_Geometry).numTimeSteps == 1) {
      auVar17 = *(undefined1 (*) [16])(pIVar3->world2local0).l.vx.field_0.m128;
      auVar21 = *(undefined1 (*) [16])(pIVar3->world2local0).l.vy.field_0.m128;
      auVar25 = *(undefined1 (*) [16])(pIVar3->world2local0).l.vz.field_0.m128;
      fVar11 = (pIVar3->world2local0).p.field_0.m128[0];
      fVar22 = (pIVar3->world2local0).p.field_0.m128[1];
      fVar26 = (pIVar3->world2local0).p.field_0.m128[2];
      fVar23 = (pIVar3->world2local0).p.field_0.m128[3];
    }
    else {
      fVar11 = (pIVar3->super_Geometry).fnumTimeSegments;
      fVar22 = (pIVar3->super_Geometry).time_range.lower;
      fVar26 = (((ray->dir).field_0.m128[3] - fVar22) /
               ((pIVar3->super_Geometry).time_range.upper - fVar22)) * fVar11;
      auVar17 = roundss(ZEXT416((uint)fVar22),ZEXT416((uint)fVar26),9);
      fVar11 = fVar11 + -1.0;
      if (fVar11 <= auVar17._0_4_) {
        auVar17._0_4_ = fVar11;
      }
      fVar11 = 0.0;
      if (0.0 <= auVar17._0_4_) {
        fVar11 = auVar17._0_4_;
      }
      fVar26 = fVar26 - fVar11;
      pAVar9 = pIVar3->local2world + (uint)(int)fVar11;
      pAVar10 = pIVar3->local2world + ((int)fVar11 + 1);
      if ((pIVar3->super_Geometry).field_8.field_0x1 == '\x01') {
        fVar11 = (pAVar9->p).field_0.m128[3];
        fVar22 = (pAVar9->l).vx.field_0.m128[3];
        fVar23 = (pAVar9->l).vy.field_0.m128[3];
        fVar31 = (pAVar9->l).vz.field_0.m128[3];
        fVar33 = (pAVar10->p).field_0.m128[3];
        fVar34 = (pAVar10->l).vx.field_0.m128[3];
        fVar36 = (pAVar10->l).vy.field_0.m128[3];
        fVar39 = (pAVar10->l).vz.field_0.m128[3];
        fVar50 = fVar31 * fVar39 + fVar23 * fVar36 + fVar11 * fVar33 + fVar22 * fVar34;
        fVar41 = -fVar50;
        if (fVar50 < fVar41) {
          fVar33 = -fVar33;
          fVar34 = -fVar34;
        }
        fVar46 = fVar41;
        fVar48 = -fVar39;
        if (fVar41 <= fVar50) {
          fVar46 = fVar50;
          fVar48 = fVar39;
        }
        fVar51 = ABS(fVar50);
        fVar39 = 1.0 - fVar51;
        if (fVar39 < 0.0) {
          fVar39 = sqrtf(fVar39);
        }
        else {
          fVar39 = SQRT(fVar39);
        }
        fVar15 = 1.5707964 -
                 fVar39 * (((((fVar51 * -0.0043095737 + 0.0192803) * fVar51 + -0.04489909) * fVar51
                            + 0.08785567) * fVar51 + -0.21450998) * fVar51 + 1.5707952);
        fVar39 = 0.0;
        if (0.0 <= fVar15) {
          fVar39 = fVar15;
        }
        fVar39 = (float)(-(uint)(1.0 < fVar51) & 0x7fc00000 |
                        ~-(uint)(1.0 < fVar51) &
                        (uint)(1.5707964 -
                              (float)((uint)-fVar39 & -(uint)(fVar46 < 0.0) |
                                     ~-(uint)(fVar46 < 0.0) & (uint)fVar39))) * fVar26;
        auVar17 = ZEXT416((uint)(fVar39 * 0.63661975));
        auVar17 = roundss(auVar17,auVar17,9);
        uVar8 = (uint)auVar17._0_4_;
        fVar39 = fVar39 - auVar17._0_4_ * 1.5707964;
        fVar51 = fVar39 * fVar39;
        fVar41 = (float)(~-(uint)(fVar50 < fVar41) & (uint)fVar36 |
                        (uint)-fVar36 & -(uint)(fVar50 < fVar41));
        uVar7 = uVar8 & 3;
        fVar50 = ((((fVar51 * -2.5963018e-07 + 2.4756235e-05) * fVar51 + -0.001388833) * fVar51 +
                  0.04166664) * fVar51 + -0.5) * fVar51 + 1.0;
        fVar39 = (((((fVar51 * -2.5029328e-08 + 2.7600126e-06) * fVar51 + -0.00019842605) * fVar51 +
                   0.008333348) * fVar51 + -0.16666667) * fVar51 + 1.0) * fVar39;
        fVar36 = fVar50;
        if ((uVar8 & 1) != 0) {
          fVar36 = fVar39;
          fVar39 = fVar50;
        }
        if (uVar7 - 1 < 2) {
          fVar36 = -fVar36;
        }
        fVar35 = fVar46 * fVar11 - fVar33;
        fVar15 = fVar46 * fVar22 - fVar34;
        fVar51 = fVar46 * fVar23 - fVar41;
        fVar50 = fVar46 * fVar31 - fVar48;
        fVar37 = fVar50 * fVar50 + fVar51 * fVar51 + fVar35 * fVar35 + fVar15 * fVar15;
        auVar25._4_4_ = 0x80000000;
        auVar25._0_4_ = fVar37;
        auVar25._8_4_ = 0x80000000;
        auVar25._12_4_ = 0x80000000;
        auVar21._4_4_ = 0x80000000;
        auVar21._0_4_ = fVar37;
        auVar21._8_4_ = 0x80000000;
        auVar21._12_4_ = 0x80000000;
        auVar17 = rsqrtss(auVar25,auVar21);
        fVar38 = auVar17._0_4_;
        fVar37 = fVar38 * fVar38 * fVar37 * -0.5 * fVar38 + fVar38 * 1.5;
        if (uVar7 < 2) {
          fVar39 = -fVar39;
        }
        fVar38 = 1.0 - fVar26;
        fVar40 = fVar38 * fVar11 + fVar33 * fVar26;
        fVar34 = fVar38 * fVar22 + fVar34 * fVar26;
        fVar33 = fVar38 * fVar23 + fVar41 * fVar26;
        fVar49 = fVar31 * fVar38 + fVar48 * fVar26;
        fVar48 = fVar49 * fVar49 + fVar33 * fVar33 + fVar40 * fVar40 + fVar34 * fVar34;
        auVar17 = rsqrtss(ZEXT416((uint)fVar48),ZEXT416((uint)fVar48));
        fVar41 = auVar17._0_4_;
        fVar41 = fVar41 * fVar41 * fVar48 * -0.5 * fVar41 + fVar41 * 1.5;
        if (0.9995 < fVar46) {
          fVar40 = fVar40 * fVar41;
          fVar34 = fVar34 * fVar41;
          fVar33 = fVar33 * fVar41;
        }
        else {
          fVar40 = fVar11 * fVar36 + fVar35 * fVar37 * fVar39;
          fVar34 = fVar22 * fVar36 + fVar15 * fVar37 * fVar39;
          fVar33 = fVar23 * fVar36 + fVar51 * fVar37 * fVar39;
        }
        fVar23 = (float)(-(uint)(0.9995 < fVar46) & (uint)(fVar49 * fVar41) |
                        ~-(uint)(0.9995 < fVar46) &
                        (uint)(fVar36 * fVar31 + fVar50 * fVar37 * fVar39));
        fVar11 = (pAVar9->l).vx.field_0.m128[0] * fVar38 + (pAVar10->l).vx.field_0.m128[0] * fVar26;
        local_f8._0_4_ =
             (pAVar9->l).vy.field_0.m128[0] * fVar38 + (pAVar10->l).vy.field_0.m128[0] * fVar26;
        local_f8._4_4_ =
             (pAVar9->l).vy.field_0.m128[1] * fVar38 + (pAVar10->l).vy.field_0.m128[1] * fVar26;
        uStack_f0._0_4_ =
             (pAVar9->l).vy.field_0.m128[2] * fVar38 + (pAVar10->l).vy.field_0.m128[2] * fVar26;
        uStack_f0._4_4_ =
             (pAVar9->l).vy.field_0.m128[3] * fVar38 + (pAVar10->l).vy.field_0.m128[3] * fVar26;
        fVar31 = (pAVar9->l).vz.field_0.m128[0] * fVar38 + (pAVar10->l).vz.field_0.m128[0] * fVar26;
        fVar36 = (pAVar9->l).vz.field_0.m128[1] * fVar38 + (pAVar10->l).vz.field_0.m128[1] * fVar26;
        fVar39 = (pAVar9->l).vz.field_0.m128[2] * fVar38 + (pAVar10->l).vz.field_0.m128[2] * fVar26;
        fVar37 = fVar38 * (pAVar9->p).field_0.m128[0] + fVar26 * (pAVar10->p).field_0.m128[0];
        fVar49 = fVar38 * (pAVar9->p).field_0.m128[1] + fVar26 * (pAVar10->p).field_0.m128[1];
        fVar42 = fVar38 * (pAVar9->p).field_0.m128[2] + fVar26 * (pAVar10->p).field_0.m128[2];
        fVar41 = fVar40 * fVar40 + fVar34 * fVar34 + -fVar33 * fVar33 + -fVar23 * fVar23;
        fVar46 = fVar34 * fVar33 + fVar40 * fVar23;
        fVar48 = fVar34 * fVar33 - fVar40 * fVar23;
        fVar50 = fVar40 * fVar40 - fVar34 * fVar34;
        fVar47 = fVar33 * fVar33 + fVar50 + -fVar23 * fVar23;
        fVar51 = fVar34 * fVar23 - fVar40 * fVar33;
        fVar43 = fVar40 * fVar33 + fVar34 * fVar23;
        fVar35 = fVar33 * fVar23 + fVar40 * fVar34;
        fVar22 = fVar33 * fVar23 - fVar40 * fVar34;
        fVar46 = fVar46 + fVar46;
        fVar51 = fVar51 + fVar51;
        fVar23 = fVar23 * fVar23 + fVar50 + -fVar33 * fVar33;
        fVar33 = fVar41 * 1.0 + fVar46 * 0.0 + fVar51 * 0.0;
        fVar34 = fVar41 * 0.0 + fVar46 * 1.0 + fVar51 * 0.0;
        fVar50 = fVar41 * 0.0 + fVar46 * 0.0 + fVar51 * 1.0;
        fVar41 = fVar41 * 0.0 + fVar46 * 0.0 + fVar51 * 0.0;
        fVar35 = fVar35 + fVar35;
        fVar48 = fVar48 + fVar48;
        fVar46 = fVar48 * 1.0 + fVar47 * 0.0 + fVar35 * 0.0;
        fVar51 = fVar48 * 0.0 + fVar47 * 1.0 + fVar35 * 0.0;
        fVar15 = fVar48 * 0.0 + fVar47 * 0.0 + fVar35 * 1.0;
        fVar48 = fVar48 * 0.0 + fVar47 * 0.0 + fVar35 * 0.0;
        auVar32._4_4_ =
             (pAVar9->l).vx.field_0.m128[2] * fVar38 + (pAVar10->l).vx.field_0.m128[2] * fVar26;
        auVar32._0_4_ =
             (pAVar9->l).vx.field_0.m128[1] * fVar38 + (pAVar10->l).vx.field_0.m128[1] * fVar26;
        auVar32._8_8_ = 0;
        auVar17 = blendps(auVar32,_local_f8,4);
        fVar43 = fVar43 + fVar43;
        fVar22 = fVar22 + fVar22;
        fVar26 = fVar43 * 1.0 + fVar22 * 0.0 + fVar23 * 0.0;
        fVar47 = fVar43 * 0.0 + fVar22 * 1.0 + fVar23 * 0.0;
        fVar44 = fVar43 * 0.0 + fVar22 * 0.0 + fVar23 * 1.0;
        fVar45 = fVar43 * 0.0 + fVar22 * 0.0 + fVar23 * 0.0;
        fVar22 = fVar45 * 0.0;
        auVar12._0_4_ = fVar11 * fVar33 + fVar46 * 0.0 + fVar26 * 0.0;
        auVar12._4_4_ = fVar11 * fVar34 + fVar51 * 0.0 + fVar47 * 0.0;
        auVar12._8_4_ = fVar11 * fVar50 + fVar15 * 0.0 + fVar44 * 0.0;
        auVar12._12_4_ = fVar11 * fVar41 + fVar48 * 0.0 + fVar22;
        fVar35 = (float)local_f8._0_4_ * fVar33 + (float)local_f8._4_4_ * fVar46 + fVar26 * 0.0;
        fVar38 = (float)local_f8._0_4_ * fVar34 + (float)local_f8._4_4_ * fVar51 + fVar47 * 0.0;
        fVar40 = (float)local_f8._0_4_ * fVar50 + (float)local_f8._4_4_ * fVar15 + fVar44 * 0.0;
        fVar43 = (float)local_f8._0_4_ * fVar41 + (float)local_f8._4_4_ * fVar48 + fVar22;
        fVar11 = fVar31 * fVar33 + fVar36 * fVar46 + fVar39 * fVar26;
        fVar22 = fVar31 * fVar34 + fVar36 * fVar51 + fVar39 * fVar47;
        fVar23 = fVar31 * fVar50 + fVar36 * fVar15 + fVar39 * fVar44;
        fVar31 = fVar31 * fVar41 + fVar36 * fVar48 + fVar39 * fVar45;
        auVar16._0_4_ = fVar37 * fVar33 + fVar49 * fVar46 + fVar42 * fVar26 + auVar17._0_4_ + 0.0;
        auVar16._4_4_ = fVar37 * fVar34 + fVar49 * fVar51 + fVar42 * fVar47 + auVar17._4_4_ + 0.0;
        auVar16._8_4_ = fVar37 * fVar50 + fVar49 * fVar15 + fVar42 * fVar44 + auVar17._8_4_ + 0.0;
      }
      else {
        fVar33 = 1.0 - fVar26;
        auVar12._0_4_ =
             (pAVar9->l).vx.field_0.m128[0] * fVar33 + (pAVar10->l).vx.field_0.m128[0] * fVar26;
        auVar12._4_4_ =
             (pAVar9->l).vx.field_0.m128[1] * fVar33 + (pAVar10->l).vx.field_0.m128[1] * fVar26;
        auVar12._8_4_ =
             (pAVar9->l).vx.field_0.m128[2] * fVar33 + (pAVar10->l).vx.field_0.m128[2] * fVar26;
        auVar12._12_4_ =
             (pAVar9->l).vx.field_0.m128[3] * fVar33 + (pAVar10->l).vx.field_0.m128[3] * fVar26;
        fVar35 = (pAVar9->l).vy.field_0.m128[0] * fVar33 + (pAVar10->l).vy.field_0.m128[0] * fVar26;
        fVar38 = (pAVar9->l).vy.field_0.m128[1] * fVar33 + (pAVar10->l).vy.field_0.m128[1] * fVar26;
        fVar40 = (pAVar9->l).vy.field_0.m128[2] * fVar33 + (pAVar10->l).vy.field_0.m128[2] * fVar26;
        fVar43 = (pAVar9->l).vy.field_0.m128[3] * fVar33 + (pAVar10->l).vy.field_0.m128[3] * fVar26;
        fVar11 = (pAVar9->l).vz.field_0.m128[0] * fVar33 + (pAVar10->l).vz.field_0.m128[0] * fVar26;
        fVar22 = (pAVar9->l).vz.field_0.m128[1] * fVar33 + (pAVar10->l).vz.field_0.m128[1] * fVar26;
        fVar23 = (pAVar9->l).vz.field_0.m128[2] * fVar33 + (pAVar10->l).vz.field_0.m128[2] * fVar26;
        fVar31 = (pAVar9->l).vz.field_0.m128[3] * fVar33 + (pAVar10->l).vz.field_0.m128[3] * fVar26;
        auVar16._0_4_ = fVar33 * (pAVar9->p).field_0.m128[0] + fVar26 * (pAVar10->p).field_0.m128[0]
        ;
        auVar16._4_4_ = fVar33 * (pAVar9->p).field_0.m128[1] + fVar26 * (pAVar10->p).field_0.m128[1]
        ;
        auVar16._8_4_ = fVar33 * (pAVar9->p).field_0.m128[2] + fVar26 * (pAVar10->p).field_0.m128[2]
        ;
      }
      fVar26 = auVar12._0_4_;
      fVar33 = auVar12._4_4_;
      fVar34 = auVar12._8_4_;
      auVar24._0_4_ = fVar35 * fVar22 - fVar38 * fVar11;
      fVar36 = fVar38 * fVar23 - fVar40 * fVar22;
      fVar39 = fVar40 * fVar11 - fVar35 * fVar23;
      auVar27._4_4_ = fVar39;
      auVar27._0_4_ = fVar36;
      auVar27._8_4_ = auVar24._0_4_;
      auVar27._12_4_ = fVar43 * fVar31 - fVar43 * fVar31;
      auVar20._0_4_ = fVar11 * fVar33 - fVar22 * fVar26;
      auVar20._4_4_ = fVar22 * fVar34 - fVar23 * fVar33;
      auVar20._8_4_ = fVar23 * fVar26 - fVar11 * fVar34;
      auVar20._12_4_ = fVar31 * auVar12._12_4_ - fVar31 * auVar12._12_4_;
      fVar11 = fVar33 * fVar40 - fVar34 * fVar38;
      auVar17 = dpps(auVar12,auVar27,0x7f);
      auVar21 = insertps(auVar20,auVar20,0x4a);
      auVar24._4_4_ = auVar20._0_4_;
      auVar24._8_4_ = fVar26 * fVar38 - fVar33 * fVar35;
      auVar24._12_4_ = 0;
      auVar30._4_4_ = fVar11;
      auVar30._0_4_ = fVar36;
      auVar30._8_4_ = fVar11;
      auVar30._12_4_ = auVar21._4_4_;
      auVar29._8_8_ = auVar30._8_8_;
      auVar29._4_4_ = auVar21._0_4_;
      auVar29._0_4_ = fVar36;
      auVar28._4_4_ = auVar21._8_4_;
      auVar28._0_4_ = fVar39;
      auVar28._8_4_ = fVar34 * fVar35 - fVar26 * fVar40;
      auVar28._12_4_ = auVar21._12_4_;
      auVar13._0_4_ = auVar17._0_4_;
      auVar13._4_4_ = auVar13._0_4_;
      auVar13._8_4_ = auVar13._0_4_;
      auVar13._12_4_ = auVar13._0_4_;
      auVar17 = divps(auVar29,auVar13);
      auVar21 = divps(auVar28,auVar13);
      auVar25 = divps(auVar24,auVar13);
      fVar23 = auVar16._0_4_;
      fVar31 = auVar16._4_4_;
      fVar33 = auVar16._8_4_;
      fVar11 = -(fVar23 * auVar17._0_4_ + fVar31 * auVar21._0_4_ + fVar33 * auVar25._0_4_);
      fVar22 = -(fVar23 * auVar17._4_4_ + fVar31 * auVar21._4_4_ + fVar33 * auVar25._4_4_);
      fVar26 = -(fVar23 * auVar17._8_4_ + fVar31 * auVar21._8_4_ + fVar33 * auVar25._8_4_);
      fVar23 = -(fVar23 * auVar17._12_4_ + fVar31 * auVar21._12_4_ + fVar33 * auVar25._12_4_);
    }
    aVar1 = (ray->org).field_0.field_1;
    fVar31 = aVar1.x;
    fVar33 = aVar1.y;
    fVar34 = aVar1.z;
    aVar2 = (ray->dir).field_0.field_1;
    fVar36 = aVar2.x;
    fVar39 = aVar2.y;
    fVar41 = aVar2.z;
    auVar18._0_4_ =
         fVar31 * auVar17._0_4_ + fVar33 * auVar21._0_4_ + fVar34 * auVar25._0_4_ + fVar11;
    auVar18._4_4_ =
         fVar31 * auVar17._4_4_ + fVar33 * auVar21._4_4_ + fVar34 * auVar25._4_4_ + fVar22;
    auVar18._8_4_ =
         fVar31 * auVar17._8_4_ + fVar33 * auVar21._8_4_ + fVar34 * auVar25._8_4_ + fVar26;
    auVar18._12_4_ =
         fVar31 * auVar17._12_4_ + fVar33 * auVar21._12_4_ + fVar34 * auVar25._12_4_ + fVar23;
    aVar19.field_1 =
         (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
         blendps(auVar18,aVar1,8);
    (ray->org).field_0 = aVar19;
    auVar14._0_4_ = fVar36 * auVar17._0_4_ + fVar39 * auVar21._0_4_ + fVar41 * auVar25._0_4_;
    auVar14._4_4_ = fVar36 * auVar17._4_4_ + fVar39 * auVar21._4_4_ + fVar41 * auVar25._4_4_;
    auVar14._8_4_ = fVar36 * auVar17._8_4_ + fVar39 * auVar21._8_4_ + fVar41 * auVar25._8_4_;
    auVar14._12_4_ = fVar36 * auVar17._12_4_ + fVar39 * auVar21._12_4_ + fVar41 * auVar25._12_4_;
    aVar19.field_1 =
         (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
         blendps(auVar14,aVar2,8);
    (ray->dir).field_0 = aVar19;
    lVar5 = *(long *)&(pIVar3->super_Geometry).field_0x58;
    (**(code **)(lVar5 + 0x80))(lVar5 + 0x58,ray);
    local_e8 = aVar1._0_8_;
    uStack_e0 = aVar1._8_8_;
    *(undefined8 *)&(ray->org).field_0 = local_e8;
    *(undefined8 *)((long)&(ray->org).field_0 + 8) = uStack_e0;
    local_f8 = aVar2._0_8_;
    uStack_f0 = aVar2._8_8_;
    *(undefined1 (*) [8])&(ray->dir).field_0 = local_f8;
    *(undefined8 *)((long)&(ray->dir).field_0 + 8) = uStack_f0;
    bVar6 = ray->tfar <= 0.0 && ray->tfar != 0.0;
    pRVar4->instID[0] = 0xffffffff;
    pRVar4->instPrimID[0] = 0xffffffff;
  }
  return bVar6;
}

Assistant:

bool InstanceIntersector1MB::occluded(const Precalculations& pre, Ray& ray, RayQueryContext* context, const InstancePrimitive& prim)
    {
      const Instance* instance = prim.instance;
      
      /* perform ray mask test */
#if defined(EMBREE_RAY_MASK)
      if ((ray.mask & instance->mask) == 0) 
        return false;
#endif
      
      RTCRayQueryContext* user_context = context->user;
      bool occluded = false;
      if (likely(instance_id_stack::push(user_context, prim.instID_, 0)))
      {
        const AffineSpace3fa world2local = instance->getWorld2Local(ray.time());
        const Vec3ff ray_org = ray.org;
        const Vec3ff ray_dir = ray.dir;
        ray.org = Vec3ff(xfmPoint(world2local, ray_org), ray.tnear());
        ray.dir = Vec3ff(xfmVector(world2local, ray_dir), ray.time());
        RayQueryContext newcontext((Scene*)instance->object, user_context, context->args);
        instance->object->intersectors.occluded((RTCRay&)ray, &newcontext);
        ray.org = ray_org;
        ray.dir = ray_dir;
        occluded = ray.tfar < 0.0f;
        instance_id_stack::pop(user_context);      
      }
      return occluded;
    }